

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsGetAndClearException(JsValueRef *exception)

{
  ScriptContext *this;
  code *pcVar1;
  bool bVar2;
  JsrtContext *pJVar3;
  undefined4 *puVar4;
  size_t sVar5;
  RecyclableData *pRVar6;
  JavascriptExceptionObject *this_00;
  Var pvVar7;
  JsErrorCode JVar8;
  undefined1 auStack_48 [8];
  AutoHandledExceptionType __autoHandledExceptionType;
  
  if (exception == (JsValueRef *)0x0) {
    JVar8 = JsErrorNullArgument;
  }
  else {
    *exception = (JsValueRef)0x0;
    pJVar3 = JsrtContext::GetCurrent();
    if (pJVar3 == (JsrtContext *)0x0) {
      JVar8 = JsErrorNoCurrentContext;
    }
    else {
      this = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      if (this == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                           ,0xc69,"(scriptContext != nullptr)","scriptContext != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      if ((this->recycler != (Recycler *)0x0) &&
         (bVar2 = Memory::Recycler::IsHeapEnumInProgress(this->recycler), bVar2)) {
        return JsErrorHeapEnumInProgress;
      }
      JVar8 = JsErrorInThreadServiceCallback;
      if ((this->threadContext->threadService).isInCallback == false) {
        sVar5 = ThreadContext::GetStackLimitForCurrentThread(this->threadContext);
        JVar8 = JsErrorInDisabledState;
        if (sVar5 != 0x7fffffffffffffff) {
          AutoHandledExceptionType::AutoHandledExceptionType
                    ((AutoHandledExceptionType *)auStack_48,ExceptionType_OutOfMemory);
          pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                             (&this->threadContext->recyclableData);
          if ((pRVar6->exceptionObject).ptr == (JavascriptExceptionObject *)0x0) {
            this_00 = (JavascriptExceptionObject *)0x0;
          }
          else {
            this_00 = Js::ScriptContext::GetAndClearRecordedException(this,(bool *)0x0);
          }
          AutoHandledExceptionType::~AutoHandledExceptionType
                    ((AutoHandledExceptionType *)auStack_48);
          if (this_00 == (JavascriptExceptionObject *)0x0) {
            JVar8 = JsErrorInvalidArgument;
          }
          else {
            JVar8 = JsNoError;
            pvVar7 = Js::JavascriptExceptionObject::GetThrownObject(this_00,(ScriptContext *)0x0);
            *exception = pvVar7;
            auStack_48 = (undefined1  [8])0x0;
            ___autoHandledExceptionType = (TTDVar *)0x0;
            if (this->TTDShouldPerformRecordAction == true) {
              TTD::EventLog::RecordJsRTGetAndClearException
                        (this->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_48);
            }
            if (this->TTDShouldPerformRecordAction == true) {
              if (___autoHandledExceptionType == (TTDVar *)0x0) {
                TTDAbort_unrecoverable_error("Why are we calling this then???");
              }
              *___autoHandledExceptionType = *exception;
            }
            if (*exception == (JsValueRef)0x0) {
              JVar8 = JsErrorInvalidArgument;
            }
          }
        }
      }
    }
  }
  return JVar8;
}

Assistant:

CHAKRA_API JsGetAndClearException(_Out_ JsValueRef *exception)
{
    PARAM_NOT_NULL(exception);
    *exception = nullptr;

    JsrtContext *currentContext = JsrtContext::GetCurrent();

    if (currentContext == nullptr)
    {
        return JsErrorNoCurrentContext;
    }

    Js::ScriptContext *scriptContext = currentContext->GetScriptContext();
    Assert(scriptContext != nullptr);

    if (scriptContext->GetRecycler() && scriptContext->GetRecycler()->IsHeapEnumInProgress())
    {
        return JsErrorHeapEnumInProgress;
    }
    else if (scriptContext->GetThreadContext()->IsInThreadServiceCallback())
    {
        return JsErrorInThreadServiceCallback;
    }

    if (scriptContext->GetThreadContext()->IsExecutionDisabled())
    {
        return JsErrorInDisabledState;
    }

    HRESULT hr = S_OK;
    Js::JavascriptExceptionObject *recordedException = nullptr;

    BEGIN_TRANSLATE_OOM_TO_HRESULT
      if (scriptContext->HasRecordedException())
      {
          recordedException = scriptContext->GetAndClearRecordedException();
      }
    END_TRANSLATE_OOM_TO_HRESULT(hr)

    if (hr == E_OUTOFMEMORY)
    {
        recordedException = scriptContext->GetThreadContext()->GetRecordedException();
    }
    if (recordedException == nullptr)
    {
        return JsErrorInvalidArgument;
    }

    *exception = recordedException->GetThrownObject(nullptr);

#if ENABLE_TTD
    if(hr != E_OUTOFMEMORY)
    {
        TTD::TTDJsRTActionResultAutoRecorder _actionEntryPopper;

        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTGetAndClearException);
        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, exception);
    }
#endif

    if (*exception == nullptr)
    {
        return JsErrorInvalidArgument;
    }

    return JsNoError;
}